

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

void __thiscall
GrcSymbolTableEntry::ReplaceClassData(GrcSymbolTableEntry *this,GdlGlyphClassDefn *pglfc)

{
  GdlDefn *in_RSI;
  GrcSymbolTableEntry *in_RDI;
  GdlGlyphClassDefn *pglfcDelete;
  long *local_30;
  
  if (in_RDI->m_pData != (GdlDefn *)0x0) {
    if (in_RDI->m_pData == (GdlDefn *)0x0) {
      local_30 = (long *)0x0;
    }
    else {
      local_30 = (long *)__dynamic_cast(in_RDI->m_pData,&GdlDefn::typeinfo,
                                        &GdlGlyphClassDefn::typeinfo,0);
    }
    (**(code **)(*local_30 + 0xd0))();
    if (in_RDI->m_pData != (GdlDefn *)0x0) {
      (*in_RDI->m_pData->_vptr_GdlDefn[1])();
    }
  }
  SetData(in_RDI,in_RSI);
  return;
}

Assistant:

void GrcSymbolTableEntry::ReplaceClassData(GdlGlyphClassDefn * pglfc)
{
	if (m_pData)
	{
		// Empty class is being deleted.
		GdlGlyphClassDefn * pglfcDelete = dynamic_cast<GdlGlyphClassDefn *>(m_pData);
		Assert(pglfcDelete);
		Assert(pglfcDelete->Name() == "");
		pglfcDelete->ComputeMembers();
		Assert(pglfcDelete->GlyphIDCount() == 0);
		delete m_pData;
	}
	SetData(pglfc);
}